

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O0

int run_test_semaphore_3(void)

{
  int iVar1;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_sem_t sem;
  
  iVar1 = uv_sem_init(&eval_a,3);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
            ,0x62,"uv_sem_init(&sem, 3)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_sem_wait(&eval_a);
  uv_sem_wait(&eval_a);
  iVar1 = uv_sem_trywait(&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
            ,0x65,"uv_sem_trywait(&sem)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_sem_trywait(&eval_a);
  if ((long)iVar1 != -0xb) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
            ,0x66,"UV_EAGAIN","==","uv_sem_trywait(&sem)",0xfffffffffffffff5,"==",(long)iVar1);
    abort();
  }
  uv_sem_post(&eval_a);
  iVar1 = uv_sem_trywait(&eval_a);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
            ,0x69,"uv_sem_trywait(&sem)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_sem_trywait(&eval_a);
  if ((long)iVar1 != -0xb) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-semaphore.c"
            ,0x6a,"UV_EAGAIN","==","uv_sem_trywait(&sem)",0xfffffffffffffff5,"==",(long)iVar1);
    abort();
  }
  uv_sem_destroy(&eval_a);
  return 0;
}

Assistant:

TEST_IMPL(semaphore_3) {
  uv_sem_t sem;

  ASSERT_OK(uv_sem_init(&sem, 3));
  uv_sem_wait(&sem); /* should not block */
  uv_sem_wait(&sem); /* should not block */
  ASSERT_OK(uv_sem_trywait(&sem));
  ASSERT_EQ(UV_EAGAIN, uv_sem_trywait(&sem));

  uv_sem_post(&sem);
  ASSERT_OK(uv_sem_trywait(&sem));
  ASSERT_EQ(UV_EAGAIN, uv_sem_trywait(&sem));

  uv_sem_destroy(&sem);

  return 0;
}